

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O2

void anon_unknown.dwarf_1d7349::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  pointer pWVar1;
  pointer pWVar2;
  Array2D<Imf_3_2::Array2D<unsigned_int>_> *this;
  Array2D<Imf_3_2::Array2D<float>_> *this_00;
  Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *this_01;
  WritingTaskData *__n;
  float fVar3;
  undefined4 uVar4;
  FrameBuffer *pFVar5;
  Header *pHVar6;
  Array2D<Imf_3_2::FrameBuffer> *pAVar7;
  pointer pWVar8;
  _Alloc_hider _Var9;
  char cVar10;
  __type _Var11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ostream *poVar23;
  ulong __new_size;
  ulong *puVar24;
  ulong *puVar25;
  ulong *puVar26;
  char *pcVar27;
  TileDescription *pTVar28;
  ulong uVar29;
  TiledOutputPart *this_02;
  OutputPart *this_03;
  ThreadPool *pTVar30;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *__dest;
  Task *pTVar31;
  Box<Imath_3_2::Vec2<int>_> *pBVar32;
  Box<Imath_3_2::Vec2<int>_> *pBVar33;
  float *pfVar34;
  float *pfVar35;
  int *piVar36;
  ChannelList *this_04;
  ChannelList *pCVar37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar39;
  long lVar40;
  pointer __p;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n_00;
  int i;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_05;
  int ty;
  int yLevel;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  size_t sVar44;
  pointer ppWVar45;
  int tx;
  ulong uVar46;
  ulong uVar47;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_06;
  ulong uVar48;
  long lVar49;
  bool bVar50;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  list;
  Array2D<float> floatData;
  TaskGroup taskGroup;
  Array2D<Imath_3_2::half> halfData;
  MultiPartOutputFile file;
  vector<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_> outputfiles;
  Array2D<unsigned_int> uintData;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> frameBuffers;
  Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> tiledFrameBuffers;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  int *numXTiles;
  size_t local_208;
  ulong local_200;
  ulong *local_1f8;
  ulong *local_1f0;
  ulong *local_1e8;
  pointer local_1e0;
  string fn;
  vector<void_*,_std::allocator<void_*>_> parts;
  
  poVar23 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar23 = (ostream *)std::ostream::operator<<(poVar23,partNumber);
  poVar23 = std::operator<<(poVar23," part(s).");
  std::endl<char,std::char_traits<char>>(poVar23);
  std::ostream::flush();
  std::operator+(&fn,tempDir,"imf_test_multipart_threading.exr");
  __new_size = (ulong)(uint)partNumber;
  lVar40 = __new_size * 0x18;
  local_200 = lVar40 + 8;
  local_208 = lVar40 - (lVar40 - 0x18U) % 0x18;
  if (partNumber < 1) {
    partNumber = 0;
  }
  uVar48 = (ulong)(uint)partNumber;
  if (randomReadCount < 1) {
    randomReadCount = 0;
  }
  if (runCount < 1) {
    runCount = 0;
  }
  iVar22 = 0;
  do {
    if (iVar22 == runCount) {
      std::__cxx11::string::~string((string *)&fn);
      return;
    }
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    uintData._sizeX = 0;
    uintData._sizeY = 0;
    uintData._data = (uint *)0x0;
    fillPixels<unsigned_int>(&uintData,0xc5,0x107);
    fillPixels<Imath_3_2::half>(&halfData,0xc5,0x107);
    fillPixels<float>(&floatData,0xc5,0x107);
    uVar41 = local_200;
    puVar24 = (ulong *)operator_new__(local_200);
    sVar44 = local_208;
    *puVar24 = __new_size;
    local_1f8 = puVar24 + 1;
    memset(local_1f8,0,local_208);
    puVar25 = (ulong *)operator_new__(uVar41);
    *puVar25 = __new_size;
    local_1f0 = puVar25 + 1;
    memset(local_1f0,0,sVar44);
    puVar26 = (ulong *)operator_new__(uVar41);
    *puVar26 = __new_size;
    local_1e8 = puVar26 + 1;
    memset(local_1e8,0,sVar44);
    outputfiles.
    super__Vector_base<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,__new_size);
    std::operator<<((ostream *)&std::cout,"Generating headers and data ");
    std::ostream::flush();
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::clear
              ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
               &(anonymous_namespace)::headers);
    for (uVar41 = 0; uVar41 != uVar48; uVar41 = uVar41 + 1) {
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      Imf_3_2::Header::Header
                ((Header *)&frameBuffers,0xc5,0x107,1.0,(Vec2 *)&parts,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      iVar12 = random_int(3);
      iVar13 = random_int(2);
      *(int *)((anonymous_namespace)::pixelTypes + uVar41 * 4) = iVar12;
      *(int *)((anonymous_namespace)::partTypes + uVar41 * 4) = iVar13;
      std::__cxx11::stringstream::stringstream((stringstream *)&parts);
      iVar18 = (int)uVar41;
      std::ostream::operator<<
                (&parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,iVar18);
      std::__cxx11::stringbuf::str();
      Imf_3_2::Header::setName((string *)&frameBuffers);
      std::__cxx11::string::~string((string *)&list);
      if (iVar12 == 0) {
        pcVar27 = (char *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel((Channel *)&list,UINT,1,1,false);
        Imf_3_2::ChannelList::insert(pcVar27,(Channel *)"UINT");
      }
      else if (iVar12 == 1) {
        pcVar27 = (char *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel((Channel *)&list,FLOAT,1,1,false);
        Imf_3_2::ChannelList::insert(pcVar27,(Channel *)"FLOAT");
      }
      else if (iVar12 == 2) {
        pcVar27 = (char *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel((Channel *)&list,HALF,1,1,false);
        Imf_3_2::ChannelList::insert(pcVar27,(Channel *)"HALF");
      }
      if (iVar13 == 1) {
        Imf_3_2::Header::setType((string *)&frameBuffers);
        iVar12 = random_int(0xc5);
        iVar13 = random_int(0x107);
        uVar14 = random_int(3);
        *(uint *)((anonymous_namespace)::levelModes + uVar41 * 4) = uVar14;
        uVar17 = 3;
        if (uVar14 < 3) {
          uVar17 = uVar14;
        }
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar13 + 1,iVar12 + 1);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)uVar17;
        Imf_3_2::Header::setTileDescription((TileDescription *)&frameBuffers);
        bVar50 = uVar14 != 1;
LAB_001724ee:
        pTVar28 = (TileDescription *)Imf_3_2::Header::tileDescription();
        Imf_3_2::precalculateTileInfo
                  (pTVar28,0,0xc4,0,0x106,&numXTiles,(int **)&file,(int *)&tiledFrameBuffers,
                   (int *)&taskGroup);
        for (lVar40 = 0; lVar40 < (int)tiledFrameBuffers._size; lVar40 = lVar40 + 1) {
          for (lVar49 = 0; lVar49 < _taskGroup; lVar49 = lVar49 + 1) {
            if (!(bool)(~bVar50 & lVar40 != lVar49)) {
              for (iVar12 = 0; iVar12 < numXTiles[lVar40]; iVar12 = iVar12 + 1) {
                for (iVar13 = 0; iVar13 < *(int *)((long)_file + lVar49 * 4); iVar13 = iVar13 + 1) {
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar12,iVar18);
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44((int)lVar40,iVar13)
                  ;
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(list.
                                         super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         (int)lVar49);
                  std::
                  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                  ::push_back(&taskList,(value_type *)&list);
                }
              }
            }
          }
        }
        if (numXTiles != (int *)0x0) {
          operator_delete__(numXTiles);
        }
        if (_file != (void *)0x0) {
          operator_delete__(_file);
        }
      }
      else {
        bVar50 = true;
        if (iVar13 != 0) goto LAB_001724ee;
        Imf_3_2::Header::setType((string *)&frameBuffers);
        iVar12 = 0x107;
        while (bVar50 = iVar12 != 0, iVar12 = iVar12 + -1, bVar50) {
          list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(list.
                                 super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar18);
          std::
          vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
          ::push_back(&taskList,(value_type *)&list);
        }
      }
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                 &(anonymous_namespace)::headers,(value_type *)&frameBuffers);
      std::__cxx11::stringstream::~stringstream((stringstream *)&parts);
      Imf_3_2::Header::~Header((Header *)&frameBuffers);
    }
    poVar23 = std::operator<<((ostream *)&std::cout,"Shuffling ");
    pWVar8 = taskList.
             super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar29 = ((long)taskList.
                    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)taskList.
                   super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x14;
    poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
    std::operator<<(poVar23," tasks ");
    std::ostream::flush();
    iVar12 = (int)uVar29;
    uVar46 = 0;
    uVar41 = uVar46;
    if (0 < iVar12) {
      uVar46 = uVar29 & 0xffffffff;
      uVar41 = uVar46;
    }
    while (iVar13 = (int)uVar46, uVar46 = (ulong)(iVar13 - 1), iVar13 != 0) {
      iVar15 = random_int(iVar12);
      iVar16 = random_int(iVar12);
      iVar13 = pWVar8[iVar15].ly;
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)CONCAT44(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,iVar13);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(pWVar8 + iVar15);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)&pWVar8[iVar15].ty;
      pWVar8[iVar15].ly = pWVar8[iVar16].ly;
      pWVar1 = pWVar8 + iVar16;
      iVar18 = pWVar1->tx;
      iVar19 = pWVar1->ty;
      iVar20 = pWVar1->lx;
      pWVar2 = pWVar8 + iVar15;
      pWVar2->partNumber = pWVar1->partNumber;
      pWVar2->tx = iVar18;
      pWVar2->ty = iVar19;
      pWVar2->lx = iVar20;
      pWVar8[iVar16].ly = iVar13;
      *(pointer *)(pWVar8 + iVar16) =
           parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
           ._M_start;
      *(pointer *)&pWVar8[iVar16].ty =
           parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
           ._M_finish;
    }
    local_1e0 = pWVar8;
    remove(fn._M_dataplus._M_p);
    _Var9 = fn._M_dataplus;
    lVar40 = DAT_001d7c30;
    pHVar6 = (anonymous_namespace)::headers;
    iVar13 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
              (&file,_Var9._M_p,pHVar6,(int)((lVar40 - (long)pHVar6) / 0x38),false,iVar13);
    std::operator<<((ostream *)&std::cout,"Writing tasks ");
    std::ostream::flush();
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
              (&frameBuffers,__new_size,(allocator_type *)&list);
    Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::Array(&tiledFrameBuffers,__new_size);
    for (uVar29 = 0; uVar29 != uVar48; uVar29 = uVar29 + 1) {
      if (*(int *)((anonymous_namespace)::partTypes + uVar29 * 4) == 0) {
        this_03 = (OutputPart *)operator_new(8);
        Imf_3_2::OutputPart::OutputPart(this_03,&file,(int)uVar29);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_03;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&parts,(void **)&list);
        setOutputFrameBuffer
                  (frameBuffers.
                   super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar29,
                   *(int *)((anonymous_namespace)::pixelTypes + uVar29 * 4),&uintData,&floatData,
                   &halfData,0xc5);
        Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)this_03);
      }
      else {
        this_02 = (TiledOutputPart *)operator_new(8);
        Imf_3_2::TiledOutputPart::TiledOutputPart(this_02,&file,(int)uVar29);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_02;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&parts,(void **)&list);
        uVar17 = Imf_3_2::TiledOutputPart::numXLevels();
        uVar14 = Imf_3_2::TiledOutputPart::numYLevels();
        this = (Array2D<Imf_3_2::Array2D<unsigned_int>_> *)(local_1e8 + uVar29 * 3);
        lVar40 = (long)(int)uVar14;
        lVar49 = (long)(int)uVar17;
        Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::resizeErase(this,lVar40,lVar49);
        this_00 = (Array2D<Imf_3_2::Array2D<float>_> *)(local_1f0 + uVar29 * 3);
        Imf_3_2::Array2D<Imf_3_2::Array2D<float>_>::resizeErase(this_00,lVar40,lVar49);
        this_01 = (Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)(local_1f8 + uVar29 * 3);
        Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::resizeErase(this_01,lVar40,lVar49);
        Imf_3_2::Array2D<Imf_3_2::FrameBuffer>::resizeErase
                  (tiledFrameBuffers._data + uVar29,lVar40,lVar49);
        uVar46 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar46 = 0;
        }
        uVar42 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar42 = 0;
        }
        for (uVar47 = 0; uVar47 != uVar42; uVar47 = uVar47 + 1) {
          for (uVar43 = 0; uVar46 != uVar43; uVar43 = uVar43 + 1) {
            iVar13 = (int)this_02;
            cVar10 = Imf_3_2::TiledOutputPart::isValidLevel(iVar13,(int)uVar47);
            if (cVar10 != '\0') {
              iVar18 = Imf_3_2::TiledOutputPart::levelWidth(iVar13);
              iVar19 = Imf_3_2::TiledOutputPart::levelHeight(iVar13);
              lVar40 = tiledFrameBuffers._data[uVar29]._sizeY;
              pFVar5 = tiledFrameBuffers._data[uVar29]._data;
              iVar13 = *(int *)((anonymous_namespace)::pixelTypes + uVar29 * 4);
              if (iVar13 == 0) {
                fillPixels<unsigned_int>(this->_data + this->_sizeY * uVar43 + uVar47,iVar18,iVar19)
                ;
              }
              else if (iVar13 == 1) {
                fillPixels<float>(this_00->_data + this_00->_sizeY * uVar43 + uVar47,iVar18,iVar19);
              }
              else if (iVar13 == 2) {
                fillPixels<Imath_3_2::half>
                          (this_01->_data + this_01->_sizeY * uVar43 + uVar47,iVar18,iVar19);
              }
              setOutputFrameBuffer
                        (pFVar5 + lVar40 * uVar43 + uVar47,
                         *(int *)((anonymous_namespace)::pixelTypes + uVar29 * 4),
                         this->_data + this->_sizeY * uVar43 + uVar47,
                         this_00->_data + this_00->_sizeY * uVar43 + uVar47,
                         this_01->_data + this_01->_sizeY * uVar43 + uVar47,iVar18);
            }
          }
        }
      }
    }
    IlmThread_3_2::TaskGroup::TaskGroup(&taskGroup);
    pTVar30 = (ThreadPool *)operator_new(0x10);
    IlmThread_3_2::ThreadPool::ThreadPool(pTVar30,0x20);
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar29 = 0;
    iVar13 = 0;
    this_06 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
               *)0x0;
    for (lVar40 = 0; uVar41 * 0x14 != lVar40; lVar40 = lVar40 + 0x14) {
      __n = (WritingTaskData *)((long)&local_1e0->partNumber + lVar40);
      if (list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        sVar44 = (long)list.
                       super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_06;
        if (sVar44 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)sVar44 >> 3);
        ppWVar45 = (pointer)0x1;
        if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
             *)list.
               super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish != this_06) {
          ppWVar45 = __p;
        }
        this_05 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   *)((long)ppWVar45 + (long)__p);
        if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
             *)0xffffffffffffffe < this_05) {
          this_05 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0xfffffffffffffff;
        }
        if (CARRY8((ulong)ppWVar45,(ulong)__p)) {
          this_05 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0xfffffffffffffff;
        }
        __dest = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)std::
                    _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                    ::_M_allocate(this_05,(size_t)__n);
        *(WritingTaskData **)((long)__dest + sVar44) = __n;
        __n_00 = extraout_RDX;
        if (0 < (long)sVar44) {
          memmove(__dest,this_06,sVar44);
          __n_00 = extraout_RDX_00;
        }
        ppWVar45 = (pointer)(sVar44 + (long)__dest);
        std::
        _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::_M_deallocate(this_06,__p,__n_00);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(&(__dest->_M_impl).super__Vector_impl_data._M_start + (long)this_05);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
      }
      else {
        *list.
         super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = __n;
        __dest = this_06;
        ppWVar45 = list.
                   super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      list.
      super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppWVar45 + 1;
      if (((int)(uVar29 / 10) * 10 + iVar13 == 0) || ((ulong)(iVar12 - 1) * 0x14 == lVar40)) {
        pTVar31 = (Task *)operator_new(0x38);
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)&numXTiles,&list);
        pAVar7 = tiledFrameBuffers._data;
        IlmThread_3_2::Task::Task(pTVar31,&taskGroup);
        *(undefined ***)pTVar31 = &PTR__WritingTask_001d4290;
        *(MultiPartOutputFile **)(pTVar31 + 0x10) = &file;
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)(pTVar31 + 0x18),
                 (vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)&numXTiles);
        *(Array2D<Imf_3_2::FrameBuffer> **)(pTVar31 + 0x30) = pAVar7;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar30);
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::~vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   *)&numXTiles);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)__dest;
      }
      iVar13 = iVar13 + -1;
      uVar29 = (ulong)((int)uVar29 + 1);
      this_06 = __dest;
    }
    for (uVar41 = 0; uVar48 != uVar41; uVar41 = uVar41 + 1) {
      operator_delete(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar41],8);
    }
    (**(code **)(*(long *)pTVar30 + 8))();
    lVar49 = *puVar24 * 0x18;
    lVar40 = lVar49;
    uVar41 = *puVar24;
    while (uVar41 != 0) {
      Imf_3_2::Array2D<Imf_3_2::Array2D<Imath_3_2::half>_>::~Array2D
                ((Array2D<Imf_3_2::Array2D<Imath_3_2::half>_> *)((long)puVar24 + lVar40 + -0x10));
      lVar40 = lVar40 + -0x18;
      uVar41 = lVar40;
    }
    operator_delete__(puVar24,lVar49 + 8);
    lVar49 = *puVar26 * 0x18;
    lVar40 = lVar49;
    uVar41 = *puVar26;
    while (uVar41 != 0) {
      Imf_3_2::Array2D<Imf_3_2::Array2D<unsigned_int>_>::~Array2D
                ((Array2D<Imf_3_2::Array2D<unsigned_int>_> *)((long)puVar26 + lVar40 + -0x10));
      lVar40 = lVar40 + -0x18;
      uVar41 = lVar40;
    }
    operator_delete__(puVar26,lVar49 + 8);
    lVar49 = *puVar25 * 0x18;
    lVar40 = lVar49;
    uVar41 = *puVar25;
    while (uVar41 != 0) {
      Imf_3_2::Array2D<Imf_3_2::Array2D<float>_>::~Array2D
                ((Array2D<Imf_3_2::Array2D<float>_> *)((long)puVar25 + lVar40 + -0x10));
      lVar40 = lVar40 + -0x18;
      uVar41 = lVar40;
    }
    operator_delete__(puVar25,lVar49 + 8);
    std::
    vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ::~vector(&list);
    IlmThread_3_2::TaskGroup::~TaskGroup(&taskGroup);
    Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::~Array(&tiledFrameBuffers);
    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector(&frameBuffers)
    ;
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&parts.super__Vector_base<void_*,_std::allocator<void_*>_>);
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&file);
    std::
    vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ::~vector(&taskList);
    std::_Vector_base<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>::
    ~_Vector_base(&outputfiles.
                   super__Vector_base<Imf_3_2::GenericOutputFile_*,_std::allocator<Imf_3_2::GenericOutputFile_*>_>
                 );
    Imf_3_2::Array2D<unsigned_int>::~Array2D(&uintData);
    Imf_3_2::Array2D<float>::~Array2D(&floatData);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&halfData);
    _Var9 = fn._M_dataplus;
    frameBuffers.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    frameBuffers.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    frameBuffers.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    iVar12 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&uintData,_Var9._M_p,iVar12,true);
    for (uVar41 = 0; iVar12 = Imf_3_2::MultiPartInputFile::parts(), uVar41 < (ulong)(long)iVar12;
        uVar41 = uVar41 + 1) {
      Imf_3_2::MultiPartInputFile::header((int)&uintData);
      pBVar32 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
      pBVar33 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
      bVar50 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar32,pBVar33);
      if (!bVar50) {
        __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pBVar32 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
      pBVar33 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
      bVar50 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar32,pBVar33);
      if (!bVar50) {
        __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
      fVar3 = *pfVar34;
      pfVar34 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar3 != *pfVar34) || (NAN(fVar3) || NAN(*pfVar34))) {
        __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29a,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar34 = (float *)Imf_3_2::Header::screenWindowCenter();
      pfVar35 = (float *)Imf_3_2::Header::screenWindowCenter();
      if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
          (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
        __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
      fVar3 = *pfVar34;
      pfVar34 = (float *)Imf_3_2::Header::screenWindowWidth();
      if ((fVar3 != *pfVar34) || (NAN(fVar3) || NAN(*pfVar34))) {
        __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      piVar36 = (int *)Imf_3_2::Header::lineOrder();
      iVar12 = *piVar36;
      piVar36 = (int *)Imf_3_2::Header::lineOrder();
      if (iVar12 != *piVar36) {
        __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      piVar36 = (int *)Imf_3_2::Header::compression();
      iVar12 = *piVar36;
      piVar36 = (int *)Imf_3_2::Header::compression();
      if (iVar12 != *piVar36) {
        __assert_fail("header.compression () == headers[i].compression ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29f,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      Imf_3_2::Header::channels();
      lVar40 = Imf_3_2::ChannelList::begin();
      Imf_3_2::Header::channels();
      lVar49 = Imf_3_2::ChannelList::begin();
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar40 + 0x120);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar40 + 0x128);
      floatData._sizeX = *(long *)(lVar49 + 0x120);
      floatData._sizeY = *(long *)(lVar49 + 0x128);
      cVar10 = Imf_3_2::Channel::operator==((Channel *)&parts,(Channel *)&floatData);
      if (cVar10 == '\0') {
        poVar23 = std::operator<<((ostream *)&std::cout," type ");
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,(int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
        poVar23 = std::operator<<(poVar23,", ");
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)floatData._sizeX);
        poVar23 = std::operator<<(poVar23," xSampling ");
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_);
        poVar23 = std::operator<<(poVar23,", ");
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,floatData._sizeX._4_4_);
        poVar23 = std::operator<<(poVar23," ySampling ");
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,(int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
        poVar23 = std::operator<<(poVar23,", ");
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)floatData._sizeY);
        poVar23 = std::operator<<(poVar23," pLinear ");
        poVar23 = std::ostream::_M_insert<bool>(SUB81(poVar23,0));
        poVar23 = std::operator<<(poVar23,", ");
        std::ostream::_M_insert<bool>(SUB81(poVar23,0));
        std::ostream::flush();
      }
      this_04 = (ChannelList *)Imf_3_2::Header::channels();
      pCVar37 = (ChannelList *)Imf_3_2::Header::channels();
      cVar10 = Imf_3_2::ChannelList::operator==(this_04,pCVar37);
      if (cVar10 == '\0') {
        __assert_fail("header.channels () == headers[i].channels ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pbVar38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::name_abi_cxx11_();
      pbVar39 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::name_abi_cxx11_();
      _Var11 = std::operator==(pbVar38,pbVar39);
      if (!_Var11) {
        __assert_fail("header.name () == headers[i].name ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pbVar38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
      pbVar39 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
      _Var11 = std::operator==(pbVar38,pbVar39);
      if (!_Var11) {
        __assert_fail("header.type () == headers[i].type ()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x2b2,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
    }
    std::operator<<((ostream *)&std::cout,"Reading whole files ");
    std::ostream::flush();
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    uVar41 = (DAT_001d7c30 - (long)(anonymous_namespace)::headers) / 0x38;
    iVar12 = 0;
    while( true ) {
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._4_4_,iVar12);
      iVar13 = (int)uVar41;
      if (iVar13 <= iVar12) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&floatData,(value_type_conflict3 *)&parts);
      iVar12 = (int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
    }
    uVar46 = 0;
    uVar29 = uVar46;
    if (0 < iVar13) {
      uVar46 = uVar41 & 0xffffffff;
      uVar29 = uVar46;
    }
    while (iVar12 = (int)uVar46, uVar46 = (ulong)(iVar12 - 1), iVar12 != 0) {
      iVar12 = random_int(iVar13);
      iVar18 = random_int(iVar13);
      uVar4 = *(undefined4 *)(floatData._sizeX + (long)iVar12 * 4);
      *(undefined4 *)(floatData._sizeX + (long)iVar12 * 4) =
           *(undefined4 *)(floatData._sizeX + (long)iVar18 * 4);
      *(undefined4 *)(floatData._sizeX + (long)iVar18 * 4) = uVar4;
    }
    for (uVar41 = 0; uVar41 != uVar29; uVar41 = uVar41 + 1) {
      iVar12 = *(int *)(floatData._sizeX + uVar41 * 4);
      lVar40 = (long)iVar12;
      if (*(int *)((anonymous_namespace)::partTypes + lVar40 * 4) == 0) {
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        setInputFrameBuffer((FrameBuffer *)&parts,
                            *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4),
                            (Array2D<unsigned_int> *)&frameBuffers,(Array2D<float> *)&list,&halfData
                            ,0xc5,0x107);
        Imf_3_2::InputPart::InputPart
                  ((InputPart *)&outputfiles,(MultiPartInputFile *)&uintData,iVar12);
        Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&outputfiles);
        Imf_3_2::InputPart::readPixels((int)&outputfiles,0);
        iVar12 = *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4);
        if (iVar12 == 0) {
          bVar50 = checkPixels<unsigned_int>((Array2D<unsigned_int> *)&frameBuffers,0xc5,0x107);
          if (!bVar50) {
            __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                          ,0x2e2,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if (iVar12 == 1) {
          bVar50 = checkPixels<float>((Array2D<float> *)&list,0xc5,0x107);
          if (!bVar50) {
            __assert_fail("checkPixels<float> (fData, width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                          ,0x2e5,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if ((iVar12 == 2) &&
                (bVar50 = checkPixels<Imath_3_2::half>(&halfData,0xc5,0x107), !bVar50)) {
          __assert_fail("checkPixels<half> (hData, width, height)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2e8,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
      }
      else {
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        Imf_3_2::TiledInputPart::TiledInputPart
                  ((TiledInputPart *)&outputfiles,(MultiPartInputFile *)&uintData,iVar12);
        iVar13 = Imf_3_2::TiledInputPart::numXLevels();
        iVar12 = Imf_3_2::TiledInputPart::numYLevels();
        iVar18 = 0;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        for (; iVar18 != iVar13; iVar18 = iVar18 + 1) {
          for (iVar19 = 0; iVar12 != iVar19; iVar19 = iVar19 + 1) {
            cVar10 = Imf_3_2::TiledInputPart::isValidLevel((int)&outputfiles,iVar18);
            if (cVar10 != '\0') {
              iVar15 = Imf_3_2::TiledInputPart::levelWidth((int)&outputfiles);
              iVar16 = Imf_3_2::TiledInputPart::levelHeight((int)&outputfiles);
              setInputFrameBuffer((FrameBuffer *)&parts,
                                  *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4),
                                  (Array2D<unsigned_int> *)&frameBuffers,(Array2D<float> *)&list,
                                  &halfData,0xc5,0x107);
              Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&outputfiles);
              iVar20 = Imf_3_2::TiledInputPart::numXTiles((int)&outputfiles);
              iVar21 = Imf_3_2::TiledInputPart::numYTiles((int)&outputfiles);
              Imf_3_2::TiledInputPart::readTiles
                        ((int)&outputfiles,0,iVar20 + -1,0,iVar21 + -1,iVar18);
              iVar20 = *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4);
              if (iVar20 == 0) {
                bVar50 = checkPixels<unsigned_int>
                                   ((Array2D<unsigned_int> *)&frameBuffers,iVar15,iVar16);
                if (!bVar50) {
                  __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x30c,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar20 == 1) {
                bVar50 = checkPixels<float>((Array2D<float> *)&list,iVar15,iVar16);
                if (!bVar50) {
                  __assert_fail("checkPixels<float> (fData, w, h)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x30f,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar20 == 2) &&
                      (bVar50 = checkPixels<Imath_3_2::half>(&halfData,iVar15,iVar16), !bVar50)) {
                __assert_fail("checkPixels<half> (hData, w, h)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x312,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
          }
        }
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&parts);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&floatData);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&uintData);
    Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(&halfData);
    Imf_3_2::Array2D<float>::~Array2D((Array2D<float> *)&list);
    Imf_3_2::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&frameBuffers);
    std::operator<<((ostream *)&std::cout,"Reading partial files ");
    std::ostream::flush();
    _Var9 = fn._M_dataplus;
    iVar12 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&parts,_Var9._M_p,iVar12,true);
    IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&frameBuffers);
    pTVar30 = (ThreadPool *)operator_new(0x10);
    IlmThread_3_2::ThreadPool::ThreadPool(pTVar30,0x20);
    iVar12 = randomReadCount;
    while (bVar50 = iVar12 != 0, iVar12 = iVar12 + -1, bVar50) {
      pTVar31 = (Task *)operator_new(0x18);
      IlmThread_3_2::Task::Task(pTVar31,(TaskGroup *)&frameBuffers);
      *(undefined ***)pTVar31 = &PTR__Task_001d42d0;
      *(vector<void_*,_std::allocator<void_*>_> **)(pTVar31 + 0x10) = &parts;
      IlmThread_3_2::ThreadPool::addTask((Task *)pTVar30);
    }
    (**(code **)(*(long *)pTVar30 + 8))(pTVar30);
    IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&frameBuffers);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&parts);
    remove(fn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    iVar22 = iVar22 + 1;
  } while( true );
}

Assistant:

void
testWriteRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    const std::string fn = tempDir + "imf_test_input_part.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readFirstPart (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str ());

        cout << endl << flush;
    }
}